

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

pair<hta::Metric_&,_bool> __thiscall
hta::Directory::emplace(Directory *this,string *name,json *config)

{
  runtime_error *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>,_bool>
  pVar1;
  pair<hta::Metric_&,_bool> pVar2;
  lock_guard<hta::OptionalMutex> guard;
  string *local_88;
  Metric *local_80;
  Metric local_78;
  
  guard._M_device = &this->mutex_;
  OptionalMutex::lock(guard._M_device);
  local_88 = name;
  make_metric(&local_78,this,name,config);
  local_80 = &local_78;
  pVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,hta::Metric>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<hta::Metric&&>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,hta::Metric>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->metrics_,&std::piecewise_construct,&local_88);
  pVar2._8_4_ = pVar1._8_4_;
  Metric::~Metric(&local_78);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::lock_guard<hta::OptionalMutex>::~lock_guard(&guard);
    pVar2.first = (Metric *)
                  ((long)pVar1.first.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
                         ._M_cur.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
                  + 0x28);
    pVar2._12_4_ = 0;
    return pVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "emplacing a metric that is already contained in a Directory is currently not supported"
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<Metric&, bool> Directory::emplace(const std::string& name, const json& config)
{
    std::lock_guard<OptionalMutex> guard(mutex_);

    auto [it, inserted] = metrics_.emplace(std::piecewise_construct, std::forward_as_tuple(name),
                                           std::forward_as_tuple(make_metric(name, config)));
    (void)it;
    if (!inserted)
    {
        throw std::runtime_error("emplacing a metric that is already contained in a Directory "
                                 "is currently not supported");
    }
    return { it->second, inserted };
}